

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int tree_5_3::preOrder(Btree t)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  Btree stack [22];
  long local_d8 [23];
  
  iVar3 = -1;
  do {
    if (t != (Btree)0x0) {
      plVar2 = local_d8 + (long)iVar3 + 1;
      do {
        *plVar2 = (long)t;
        t = t->left;
        iVar3 = iVar3 + 1;
        plVar2 = plVar2 + 1;
      } while (t != (node *)0x0);
    }
    lVar1 = local_d8[iVar3];
    printf("%c\t",(ulong)*(uint *)(lVar1 + 0x10));
    t = *(Btree *)(lVar1 + 8);
    bVar4 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while ((bVar4) || (t != (Btree)0x0));
  putchar(10);
}

Assistant:

int preOrder(Btree t) {
        Btree p = t, stack[22];
        int top = -1;
        do {
            while (p != nullptr) {
                stack[++top] = p;
                p = p->left;
            }
            p = stack[top--];
            printf("%c\t", p->data);
            p = p->right;
        } while (top != -1 || p != nullptr);
        puts("");
    }